

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

bool __thiscall RenX::Server::removeCommand(Server *this,GameCommand *command)

{
  unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *puVar1;
  iterator __position;
  
  __position._M_current =
       (this->m_commands).
       super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_commands).
           super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current == puVar1) {
    return false;
  }
  do {
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>._M_t.
        super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>.
        super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl == command) {
      std::
      vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
      ::_M_erase(&this->m_commands,__position);
      return true;
    }
    __position._M_current = __position._M_current + 1;
  } while (__position._M_current != puVar1);
  return false;
}

Assistant:

bool RenX::Server::removeCommand(RenX::GameCommand *command) {
	for (auto itr = m_commands.begin(); itr != m_commands.end(); ++itr) {
		if (itr->get() == command) {
			m_commands.erase(itr);
			return true;
		}
	}

	return false;
}